

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<288,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  Blob<256> h;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_a8;
  Blob<288> local_88;
  value_type local_58;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x120,pcVar2,(ulong)(uint)setbits)
  ;
  local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.bytes[0x20] = '\0';
  local_88.bytes[0x21] = '\0';
  local_88.bytes[0x22] = '\0';
  local_88.bytes[0x23] = '\0';
  local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.bytes._0_32_ = ZEXT432(0) << 0x40;
  if (iVar3 != 0) {
    local_58.bytes = (uint8_t  [32])local_88.bytes._0_32_;
    (*hash.m_hash)(&local_88,0x24,0,&local_58);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back(&local_a8,&local_58);
  }
  SparseKeygenRecurse<Blob<288>,Blob<256>>(hash.m_hash,0,setbits,inclusive,&local_88,&local_a8);
  printf("%d keys\n",
         (ulong)((long)local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 5);
  bVar1 = TestHashList<Blob<256>>(&local_a8,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}